

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O2

void __thiscall
Potassco::ProgramOptions::anon_unknown_15::CommandLineParser::doParse(CommandLineParser *this)

{
  byte bVar1;
  Option *pOVar2;
  ParseContext *pPVar3;
  vector<const_char_*,_std::allocator<const_char_*>_> *this_00;
  int iVar4;
  undefined4 extraout_var;
  IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *pIVar5;
  ulong uVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SyntaxError *pSVar7;
  bool bVar8;
  Option *temp;
  char *pcVar9;
  SharedOptPtr on;
  char optn [2];
  undefined6 uStack_96;
  char *curr;
  ulong local_88;
  vector<const_char_*,_std::allocator<const_char_*>_> *local_80;
  SharedOptPtr o;
  undefined1 local_68;
  string name;
  
  local_80 = &this->remaining;
  local_88 = 0;
LAB_0018db95:
  bVar8 = false;
  do {
    iVar4 = (*(this->super_OptionParser)._vptr_OptionParser[3])(this);
    this_00 = local_80;
    pcVar9 = (char *)CONCAT44(extraout_var,iVar4);
    if ((pcVar9 == (char *)0x0) || (bVar8)) {
      while (pcVar9 != (char *)0x0) {
        curr = pcVar9;
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back(this_00,&curr);
        iVar4 = (*(this->super_OptionParser)._vptr_OptionParser[3])(this);
        pcVar9 = (char *)CONCAT44(extraout_var_02,iVar4);
      }
      return;
    }
    curr = pcVar9;
    if (*pcVar9 != '-') {
LAB_0018dee8:
      pPVar3 = (this->super_OptionParser).ctx_;
      (*pPVar3->_vptr_ParseContext[3])((string *)&o,pPVar3,local_88,pcVar9);
      if (o.ptr_ != (Option *)0x0) {
        std::__cxx11::string::string((string *)&name,curr,(allocator *)optn);
        pPVar3 = (this->super_OptionParser).ctx_;
        (*pPVar3->_vptr_ParseContext[4])(pPVar3,(string *)&o,&name);
        std::__cxx11::string::~string((string *)&name);
        curr = (char *)0x0;
      }
      local_88 = (ulong)((int)local_88 + 1);
      goto LAB_0018df3f;
    }
    if (pcVar9[1] != '-') {
      if (pcVar9[1] == '\0') goto LAB_0018dee8;
      optn[1] = '\0';
      o.ptr_ = (Option *)0x0;
      pcVar9 = pcVar9 + 2;
      break;
    }
    if (pcVar9[2] != '\0') goto LAB_0018dc95;
    curr = (char *)0x0;
    bVar8 = true;
  } while( true );
LAB_0018dc01:
  if (pcVar9[-1] == '\0') goto LAB_0018ded5;
  optn[0] = pcVar9[-1];
  pPVar3 = (this->super_OptionParser).ctx_;
  (*pPVar3->_vptr_ParseContext[2])(&name,pPVar3,(allocator *)optn,4);
  pIVar5 = detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::operator=
                     ((IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)&o,
                      (IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)&name);
  pOVar2 = pIVar5->ptr_;
  detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::~IntrusiveSharedPtr
            ((IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)&name);
  if (pOVar2 == (Option *)0x0) goto LAB_0018df3f;
  bVar1 = (o.ptr_)->value_->flags_;
  if ((bVar1 & 1) == 0) {
    if (*pcVar9 == '\0') {
      iVar4 = (*(this->super_OptionParser)._vptr_OptionParser[3])(this);
      pcVar9 = (char *)CONCAT44(extraout_var_01,iVar4);
      if (pcVar9 == (char *)0x0) {
        pSVar7 = (SyntaxError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string((string *)&name,optn,(allocator *)&on);
        SyntaxError::SyntaxError(pSVar7,missing_value,&name);
        __cxa_throw(pSVar7,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
      }
    }
    std::__cxx11::string::string((string *)&name,pcVar9,(allocator *)&on);
    pPVar3 = (this->super_OptionParser).ctx_;
    (*pPVar3->_vptr_ParseContext[4])(pPVar3,(string *)&o,&name);
LAB_0018decd:
    std::__cxx11::string::~string((string *)&name);
    goto LAB_0018ded5;
  }
  if ((~bVar1 & 3) != 0) {
    std::__cxx11::string::string((string *)&name,pcVar9,(allocator *)&on);
    pPVar3 = (this->super_OptionParser).ctx_;
    (*pPVar3->_vptr_ParseContext[4])(pPVar3,(string *)&o,&name);
    goto LAB_0018decd;
  }
  std::__cxx11::string::string((string *)&name,"",(allocator *)&on);
  pPVar3 = (this->super_OptionParser).ctx_;
  (*pPVar3->_vptr_ParseContext[4])(pPVar3,(string *)&o,&name);
  std::__cxx11::string::~string((string *)&name);
  pcVar9 = pcVar9 + 1;
  goto LAB_0018dc01;
LAB_0018df3f:
  detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::~IntrusiveSharedPtr
            ((IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)&o);
  goto LAB_0018df47;
LAB_0018ded5:
  detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::~IntrusiveSharedPtr
            ((IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)&o);
  goto LAB_0018dedd;
LAB_0018dc95:
  std::__cxx11::string::string((string *)&name,pcVar9 + 2,(allocator *)&o);
  o.ptr_ = (Option *)&stack0xffffffffffffff98;
  local_68 = 0;
  uVar6 = std::__cxx11::string::find((char)&name,0x3d);
  if (uVar6 != 0xffffffffffffffff) {
    std::__cxx11::string::assign((string *)&o,(ulong)&name,uVar6 + 1);
    std::__cxx11::string::erase((ulong)&name,uVar6);
  }
  _optn = (Option *)0x0;
  on.ptr_ = (Option *)0x0;
  if (((pcVar9[2] == 'n') && (pcVar9[3] == 'o')) && (pcVar9[4] == '-')) {
    pPVar3 = (this->super_OptionParser).ctx_;
    (*pPVar3->_vptr_ParseContext[2])
              ((IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)&stack0xffffffffffffffc8,
               pPVar3,pcVar9 + 5,3);
    detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::operator=
              (&on,(IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)&stack0xffffffffffffffc8)
    ;
    detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::~IntrusiveSharedPtr
              ((IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)&stack0xffffffffffffffc8);
    if ((on.ptr_ != (Option *)0x0) && (((on.ptr_)->value_->flags_ & 8) == 0)) {
      detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::reset(&on);
    }
  }
  pPVar3 = (this->super_OptionParser).ctx_;
  (*pPVar3->_vptr_ParseContext[2])
            ((IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)&stack0xffffffffffffffc8,pPVar3
             ,name._M_dataplus._M_p,3);
  detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::operator=
            ((IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)optn,
             (IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)&stack0xffffffffffffffc8);
  detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::~IntrusiveSharedPtr
            ((IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)&stack0xffffffffffffffc8);
  if (_optn == (Option *)0x0) {
    if (on.ptr_ != (Option *)0x0) {
      _optn = on.ptr_;
      on.ptr_ = (Option *)0x0;
      std::__cxx11::string::assign((char *)&o);
      if (_optn != (Option *)0x0) goto LAB_0018dde0;
    }
    detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::~IntrusiveSharedPtr(&on);
    detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::~IntrusiveSharedPtr
              ((IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)optn);
    std::__cxx11::string::~string((string *)&o);
    std::__cxx11::string::~string((string *)&name);
LAB_0018df47:
    if (curr != (char *)0x0) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back(local_80,&curr);
    }
    goto LAB_0018db95;
  }
LAB_0018dde0:
  if ((_optn->value_->flags_ & 1) == 0) {
    iVar4 = (*(this->super_OptionParser)._vptr_OptionParser[3])(this);
    if (CONCAT44(extraout_var_00,iVar4) == 0) {
      pSVar7 = (SyntaxError *)__cxa_allocate_exception(0x38);
      SyntaxError::SyntaxError(pSVar7,missing_value,&name);
      __cxa_throw(pSVar7,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
    }
    std::__cxx11::string::assign((char *)&o);
  }
  pPVar3 = (this->super_OptionParser).ctx_;
  (*pPVar3->_vptr_ParseContext[4])
            (pPVar3,(IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)optn,(string *)&o);
  detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::~IntrusiveSharedPtr(&on);
  detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::~IntrusiveSharedPtr
            ((IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)optn);
  std::__cxx11::string::~string((string *)&o);
  std::__cxx11::string::~string((string *)&name);
LAB_0018dedd:
  curr = (char *)0x0;
  goto LAB_0018db95;
}

Assistant:

void doParse() {
		bool breakEarly = false;
		int  posKey = 0;
		const char* curr;
		while ((curr = next()) != 0 && !breakEarly) {
			switch (getOptionType(curr)) {
				case short_opt: if (handleShortOpt(curr + 1)) curr = 0; break;
				case long_opt:  if (handleLongOpt(curr + 2))  curr = 0; break;
				case end_opt:   curr = 0; breakEarly = true; break;
				case no_opt: {
					SharedOptPtr opt = getOption(posKey++, curr);
					if (opt.get()) {
						addOptionValue(opt, curr);
						curr = 0;
					}
					break; }
				default:
					assert(0);
			}
			if (curr) {
				remaining.push_back(curr);
			}
		}
		while (curr) {
			remaining.push_back(curr);
			curr = next();
		}
	}